

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetPrivkeyFromExtkey(void *handle,char *extkey,int network_type,char **privkey,char **wif)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 *in_RCX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  string key;
  HDWalletApi api;
  NetType net_type;
  bool is_bitcoin;
  char *work_wif;
  char *work_privkey;
  string *in_stack_fffffffffffffdf0;
  string *this;
  undefined8 in_stack_fffffffffffffdf8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe00;
  bool *in_stack_fffffffffffffe38;
  allocator *paVar4;
  string *in_stack_fffffffffffffe40;
  allocator local_179;
  string local_178 [32];
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [10];
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  NetType in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  HDWalletApi *in_stack_ffffffffffffff28;
  HDWalletApi local_cb;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  NetType local_90;
  byte local_8b;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  char *local_40;
  char *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(local_18);
  if (bVar2) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x78b;
    local_68.funcname = "CfdGetPrivkeyFromExtkey";
    cfd::core::logger::warn<>(&local_68,"extkey is null or empty.");
    local_8a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. extkey is null or empty.",&local_89)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,error_code,in_stack_fffffffffffffdf0);
    local_8a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_8b = 1;
  local_90 = cfd::capi::ConvertNetType
                       ((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),in_stack_fffffffffffffe38);
  if ((local_8b & 1) == 0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x794;
    local_a8.funcname = "CfdGetPrivkeyFromExtkey";
    cfd::core::logger::warn<>(&local_a8,"privkey\'s network_type is invalid.");
    local_ca = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Failed to parameter. privkey\'s network_type is invalid.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,error_code,in_stack_fffffffffffffdf0);
    local_ca = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::api::HDWalletApi::HDWalletApi(&local_cb);
  std::__cxx11::string::string(local_f0);
  pcVar1 = local_18;
  if (local_28 != (undefined8 *)0x0) {
    paVar4 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pcVar1,paVar4);
    cfd::api::HDWalletApi::GetPrivkeyFromExtkey
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               (bool)in_stack_ffffffffffffff1b,(bool)in_stack_ffffffffffffff1a);
    std::__cxx11::string::operator=(local_f0,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_38 = cfd::capi::CreateString(in_stack_fffffffffffffe40);
  }
  if (local_30 != (undefined8 *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,local_18,&local_179);
    cfd::api::HDWalletApi::GetPrivkeyFromExtkey
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               (bool)in_stack_ffffffffffffff1b,(bool)in_stack_ffffffffffffff1a);
    this = local_158;
    std::__cxx11::string::operator=(local_f0,this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffffe40);
  }
  if (local_38 != (char *)0x0) {
    *local_28 = local_38;
  }
  if (local_40 != (char *)0x0) {
    *local_30 = local_40;
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_f0);
  return local_4;
}

Assistant:

int CfdGetPrivkeyFromExtkey(
    void* handle, const char* extkey, int network_type, char** privkey,
    char** wif) {
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key;
    if (privkey != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, false);
      work_privkey = CreateString(key);
    }
    if (wif != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, true);
      work_wif = CreateString(key);
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}